

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void * sqlite3ParserAddCleanup(Parse *pParse,_func_void_sqlite3_ptr_void_ptr *xCleanup,void *pPtr)

{
  int iVar1;
  ParseCleanup *pPVar2;
  
  if ((sqlite3Config.xTestCallback == (_func_int_int *)0x0) ||
     (iVar1 = (*sqlite3Config.xTestCallback)(300), iVar1 == 0)) {
    if (pParse->db == (sqlite3 *)0x0) {
      pPVar2 = (ParseCleanup *)sqlite3Malloc(0x18);
    }
    else {
      pPVar2 = (ParseCleanup *)sqlite3DbMallocRawNN(pParse->db,0x18);
    }
    if (pPVar2 != (ParseCleanup *)0x0) {
      pPVar2->pNext = pParse->pCleanup;
      pParse->pCleanup = pPVar2;
      pPVar2->pPtr = pPtr;
      pPVar2->xCleanup = xCleanup;
      return pPtr;
    }
  }
  else {
    sqlite3OomFault(pParse->db);
  }
  (*xCleanup)(pParse->db,pPtr);
  return (void *)0x0;
}

Assistant:

SQLITE_PRIVATE void *sqlite3ParserAddCleanup(
  Parse *pParse,                      /* Destroy when this Parser finishes */
  void (*xCleanup)(sqlite3*,void*),   /* The cleanup routine */
  void *pPtr                          /* Pointer to object to be cleaned up */
){
  ParseCleanup *pCleanup;
  if( sqlite3FaultSim(300) ){
    pCleanup = 0;
    sqlite3OomFault(pParse->db);
  }else{
    pCleanup = sqlite3DbMallocRaw(pParse->db, sizeof(*pCleanup));
  }
  if( pCleanup ){
    pCleanup->pNext = pParse->pCleanup;
    pParse->pCleanup = pCleanup;
    pCleanup->pPtr = pPtr;
    pCleanup->xCleanup = xCleanup;
  }else{
    xCleanup(pParse->db, pPtr);
    pPtr = 0;
#if defined(SQLITE_DEBUG) || defined(SQLITE_COVERAGE_TEST)
    pParse->earlyCleanup = 1;
#endif
  }
  return pPtr;
}